

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O2

REF_STATUS ref_egads_twod_flat_z(REF_GEOM ref_geom,REF_BOOL *flat)

{
  printf("returning REF_FALSE from %s, No EGADS\n","ref_egads_twod_flat_z");
  *flat = 0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_twod_flat_z(REF_GEOM ref_geom, REF_BOOL *flat) {
#ifdef HAVE_EGADS
  ego object;
  double box[6];
  REF_DBL diag, dz, flat_tol = 1.0e5;

  object = (ego)(ref_geom->body);
  RNS(object, "EGADS body object is NULL. Has the geometry been loaded?");

  REIS(EGADS_SUCCESS, EG_getBoundingBox(object, box), "EG bounding box");
  diag = sqrt((box[0] - box[3]) * (box[0] - box[3]) +
              (box[1] - box[4]) * (box[1] - box[4]));
  dz = sqrt((box[2] - box[5]) * (box[2] - box[5]));
  *flat = (diag > flat_tol * dz);

#else
  printf("returning REF_FALSE from %s, No EGADS\n", __func__);
  *flat = REF_FALSE;
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
#endif

  return REF_SUCCESS;
}